

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O0

void __thiscall ShellLinkAndJumpListHandler::parseFile(ShellLinkAndJumpListHandler *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  int local_6c;
  iterator iStack_68;
  uint hValue;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined1 local_48 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> headerValue;
  bool isDestListStructFound;
  ShellLinkAndJumpListHandler *this_local;
  
  headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_48 + 0x18));
  do {
    ReadStream::read((ReadStream *)local_48,(int)this->rs,(void *)(ulong)(uint)this->startPosition,4
                    );
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_48 + 0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (this_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    local_60._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_00);
    iStack_68 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
    std::
    reverse<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_60,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )iStack_68._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_88,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_48 + 0x18))
    ;
    iVar1 = Utils::lenFourBytesChar(&local_88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
    local_6c = iVar1;
    if (iVar1 == 0x4c) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_a0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_48 + 0x18));
      parseLNKStruct(this,&local_a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_a0);
    }
    if (((headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) &&
       (((local_6c == 1 || (local_6c == 3)) || (local_6c == 4)))) {
      headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = parseJumpListStruct(this);
    }
    this->startPosition = this->startPosition + 4;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_48 + 0x18));
  } while (sVar2 != 0);
  if ((headerValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"DestList structure not found.");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"This may be because not all LNK structures are found, ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"or because the DestList is not located after the LNK stream, ")
    ;
    poVar3 = std::operator<<(poVar3,"or because file doesn\'t contain DestList at all.");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"The total number of Shell Link = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->countOfShellLink);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "The number of Shell Link with errors while parsing = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::dec);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->countOfShellLinkWithErrors);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_48 + 0x18));
  return;
}

Assistant:

void ShellLinkAndJumpListHandler::parseFile() {
    bool isDestListStructFound = false;
    std::vector<unsigned char> headerValue;
    do {
        headerValue =  rs->read(startPosition,4);

        reverse(headerValue.begin(), headerValue.end());
        unsigned int hValue = Utils::lenFourBytesChar(headerValue);

        if(hValue == 0x0000004c) { /* Decode ShellLink Stream = CustDest Jump List */
            ShellLinkAndJumpListHandler::parseLNKStruct(headerValue);
        }
        /* 0x00000004 - Windows 10
         * 0x00000003 - Windows 10
         * 0x00000001 - Windows 7
         * 0x00000001 - Windows 8 */
        if(!isDestListStructFound && (hValue == 0x00000001 || hValue == 0x00000003 || hValue == 0x00000004))
            isDestListStructFound = ShellLinkAndJumpListHandler::parseJumpListStruct();

        startPosition += 4;
    } while(headerValue.size() != 0);

    if(!isDestListStructFound)
        cout << "DestList structure not found." << endl
        << "This may be because not all LNK structures are found, " << endl <<
           "or because the DestList is not located after the LNK stream, " <<
           "or because file doesn't contain DestList at all." << endl << endl << endl;
    cout << "The total number of Shell Link = " << dec << countOfShellLink << endl;
    cout << "The number of Shell Link with errors while parsing = " << dec << countOfShellLinkWithErrors << endl;
}